

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O2

vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
* __thiscall
libtorrent::dht::dht_tracker::live_nodes
          (vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
           *__return_storage_ptr__,dht_tracker *this,node_id *nid)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Any_data local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var2 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header) {
      return __return_storage_ptr__;
    }
    bVar1 = digest32<160L>::operator==((digest32<160L> *)&p_Var2[4]._M_left,nid);
    if (bVar1) break;
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  }
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<void_(const_libtorrent::dht::node_entry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/duality-solutions[P]libbdaptorrent/src/kademlia/dht_tracker.cpp:583:40)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(const_libtorrent::dht::node_entry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/duality-solutions[P]libbdaptorrent/src/kademlia/dht_tracker.cpp:583:40)>
             ::_M_manager;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_40._M_unused._M_object = __return_storage_ptr__;
  routing_table::for_each_node
            ((routing_table *)&p_Var2[5]._M_parent,
             (function<void_(const_libtorrent::dht::node_entry_&)> *)&local_40,
             (function<void_(const_libtorrent::dht::node_entry_&)> *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<node_id, udp::endpoint>> dht_tracker::live_nodes(node_id const& nid)
	{
		std::vector<std::pair<node_id, udp::endpoint>> ret;

		auto n = std::find_if(m_nodes.begin(), m_nodes.end()
			, [&](tracker_nodes_t::value_type const& v) { return v.second.dht.nid() == nid; });

		if (n != m_nodes.end())
		{
			n->second.dht.m_table.for_each_node([&ret](node_entry const& e)
				{ ret.emplace_back(e.id, e.endpoint); }, nullptr);
		}

		return ret;
	}